

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::UnaryExpression::fromSyntax
          (Compilation *compilation,PrefixUnaryExpressionSyntax *syntax,ASTContext *context)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ExpressionSyntax *syntax_00;
  Expression *args_2;
  Type *args_1;
  UnaryExpression *expr;
  Diagnostic *diag;
  SourceLocation SVar4;
  logic_error *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  SourceRange sourceRange;
  bool local_109;
  Type *type;
  allocator<char> local_f9;
  SourceRange local_f8;
  UnaryOperator op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  op = Expression::getUnaryOperator((syntax->super_ExpressionSyntax).super_SyntaxNode.kind);
  uVar3 = op - Preincrement;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->operand);
  args_2 = Expression::create(compilation,syntax_00,context,
                              (bitmask<slang::ast::ASTFlags>)((ulong)(uVar3 < 4) << 0x16),
                              (Type *)0x0);
  args_1 = not_null<const_slang::ast::Type_*>::get(&args_2->type);
  type = args_1;
  local_f8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::UnaryExpression,slang::ast::UnaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&op,args_1,args_2,&local_f8);
  bVar2 = Expression::bad(args_2);
  if (bVar2) goto LAB_0031c2b5;
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&syntax->attributes);
  ASTContext::setAttributes(context,&expr->super_Expression,syntax_01);
  switch((syntax->super_ExpressionSyntax).super_SyntaxNode.kind) {
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
    local_109 = Type::isIntegral(type);
    break;
  case UnaryBitwiseNotExpression:
    bVar2 = Type::isIntegral(type);
    goto LAB_0031c257;
  case UnaryLogicalNotExpression:
    local_109 = Type::isNumeric(type);
    break;
  case UnaryMinusExpression:
  case UnaryPlusExpression:
    bVar2 = Type::isNumeric(type);
LAB_0031c257:
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
              ((not_null<slang::ast::Type_const*> *)&local_f8,&type);
    (expr->super_Expression).type.ptr = (Type *)local_f8.startLoc;
    if (bVar2 != false) {
      return &expr->super_Expression;
    }
    goto LAB_0031c279;
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
    uVar1 = (context->flags).m_bits;
    if (((uint)uVar1 & 0xa0) != 0x80 && (uVar1 & 0x40) == 0) {
      local_109 = Type::isNumeric(type);
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                ((not_null<slang::ast::Type_const*> *)&local_f8,&type);
      (expr->super_Expression).type.ptr = (Type *)local_f8.startLoc;
      SVar4 = parsing::Token::location(&syntax->operatorToken);
      bVar2 = Expression::requireLValue
                        (args_2,context,SVar4,(bitmask<slang::ast::AssignFlags>)0x0,
                         (Expression *)0x0,(EvalContext *)0x0);
      if (!bVar2) goto LAB_0031c2b5;
      goto LAB_0031c1ec;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x500007,sourceRange);
    goto LAB_0031c2b5;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,&local_f9);
    std::operator+(&local_70,&local_90,":");
    std::__cxx11::to_string(&local_b0,0x173);
    std::operator+(&local_50,&local_70,&local_b0);
    std::operator+(&local_d0,&local_50,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                   &local_d0,"Default case should be unreachable!");
    std::logic_error::logic_error(this,(string *)&local_f8);
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = Type::isFourState(type);
  local_d0._M_dataplus._M_p = (pointer)compilation->scalarTypeTable[(ulong)bVar2 + 8];
  not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
            ((not_null<slang::ast::Type_const*> *)&local_f8,(Type **)&local_d0);
  (expr->super_Expression).type.ptr = (Type *)local_f8.startLoc;
  Expression::selfDetermined(context,&expr->operand_);
LAB_0031c1ec:
  if (local_109 == false) {
LAB_0031c279:
    SVar4 = parsing::Token::location(&syntax->operatorToken);
    diag = ASTContext::addDiag(context,(DiagCode)0x310007,SVar4);
    ast::operator<<(diag,type);
    Diagnostic::operator<<(diag,args_2->sourceRange);
LAB_0031c2b5:
    expr = (UnaryExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& UnaryExpression::fromSyntax(Compilation& compilation,
                                        const PrefixUnaryExpressionSyntax& syntax,
                                        const ASTContext& context) {
    auto op = getUnaryOperator(syntax.kind);
    bitmask<ASTFlags> extraFlags;
    if (isLValueOp(op))
        extraFlags = ASTFlags::LValue;

    Expression& operand = create(compilation, *syntax.operand, context, extraFlags);
    const Type* type = operand.type;

    auto result = compilation.emplace<UnaryExpression>(op, *type, operand, syntax.sourceRange());
    if (operand.bad())
        return badExpr(compilation, result);

    context.setAttributes(*result, syntax.attributes);

    bool good;
    switch (syntax.kind) {
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
            // Supported for both integral and real types. Result is same as input type.
            good = type->isNumeric();
            result->type = type;
            break;
        case SyntaxKind::UnaryLogicalNotExpression:
            // Supported for both integral and real types. Result is a single bit.
            good = type->isNumeric();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryBitwiseNotExpression:
            // Supported for integral only. Result is same as input type.
            good = type->isIntegral();
            result->type = type;
            break;
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
            // Supported for integral only. Result type is always a single bit.
            good = type->isIntegral();
            result->type = type->isFourState() ? &compilation.getLogicType()
                                               : &compilation.getBitType();
            selfDetermined(context, result->operand_);
            break;
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            if ((context.flags.has(ASTFlags::NonProcedural) &&
                 !context.flags.has(ASTFlags::AssignmentAllowed)) ||
                context.flags.has(ASTFlags::AssignmentDisallowed)) {
                context.addDiag(diag::IncDecNotAllowed, syntax.sourceRange());
                return badExpr(compilation, result);
            }

            // Supported for both integral and real types. Result is same as input type.
            // The operand must also be an assignable lvalue.
            // TODO: detect and warn for multiple reads and writes of a single variable in an
            // expression
            good = type->isNumeric();
            result->type = type;
            if (!operand.requireLValue(context, syntax.operatorToken.location())) {
                return badExpr(compilation, result);
            }

            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadUnaryExpression, syntax.operatorToken.location());
        diag << *type;
        diag << operand.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}